

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

Expr * sqlite3CreateColumnExpr(sqlite3 *db,SrcList *pSrc,int iSrc,int iCol)

{
  Bitmask *pBVar1;
  Table *pTVar2;
  Expr *pEVar3;
  int iVar4;
  Bitmask BVar5;
  
  pEVar3 = (Expr *)sqlite3DbMallocRawNN(db,0x48);
  if (pEVar3 != (Expr *)0x0) {
    pEVar3->op = '\0';
    pEVar3->affExpr = '\0';
    pEVar3->op2 = '\0';
    pEVar3->field_0x3 = 0;
    pEVar3->flags = 0;
    (pEVar3->u).zToken = (char *)0x0;
    pEVar3->iColumn = 0;
    pEVar3->iAgg = 0;
    pEVar3->w = (anon_union_4_2_009eaf8f_for_w)0x0;
    pEVar3->pAggInfo = (AggInfo *)0x0;
    (pEVar3->x).pList = (ExprList *)0x0;
    pEVar3->nHeight = 0;
    pEVar3->iTable = 0;
    pEVar3->pLeft = (Expr *)0x0;
    pEVar3->pRight = (Expr *)0x0;
    (pEVar3->y).pTab = (Table *)0x0;
    pEVar3->op = 0xa8;
    pEVar3->iAgg = -1;
    pEVar3->nHeight = 1;
    pTVar2 = pSrc->a[iSrc].pSTab;
    (pEVar3->y).pTab = pTVar2;
    pEVar3->iTable = pSrc->a[iSrc].iCursor;
    if (pTVar2->iPKey == iCol) {
      pEVar3->iColumn = -1;
    }
    else {
      pEVar3->iColumn = (ynVar)iCol;
      if (((pTVar2->tabFlags & 0x60) == 0) || ((pTVar2->aCol[iCol].colFlags & 0x60) == 0)) {
        iVar4 = 0x3f;
        if (iCol < 0x3f) {
          iVar4 = iCol;
        }
        pBVar1 = &pSrc->a[iSrc].colUsed;
        *pBVar1 = *pBVar1 | 1L << ((byte)iVar4 & 0x3f);
      }
      else {
        BVar5 = ~(-1L << ((byte)pTVar2->nCol & 0x3f));
        if (0x3f < pTVar2->nCol) {
          BVar5 = 0xffffffffffffffff;
        }
        pSrc->a[iSrc].colUsed = BVar5;
      }
    }
  }
  return pEVar3;
}

Assistant:

SQLITE_PRIVATE Expr *sqlite3CreateColumnExpr(sqlite3 *db, SrcList *pSrc, int iSrc, int iCol){
  Expr *p = sqlite3ExprAlloc(db, TK_COLUMN, 0, 0);
  if( p ){
    SrcItem *pItem = &pSrc->a[iSrc];
    Table *pTab;
    assert( ExprUseYTab(p) );
    pTab = p->y.pTab = pItem->pSTab;
    p->iTable = pItem->iCursor;
    if( p->y.pTab->iPKey==iCol ){
      p->iColumn = -1;
    }else{
      p->iColumn = (ynVar)iCol;
      if( (pTab->tabFlags & TF_HasGenerated)!=0
       && (pTab->aCol[iCol].colFlags & COLFLAG_GENERATED)!=0
      ){
        testcase( pTab->nCol==63 );
        testcase( pTab->nCol==64 );
        pItem->colUsed = pTab->nCol>=64 ? ALLBITS : MASKBIT(pTab->nCol)-1;
      }else{
        testcase( iCol==BMS );
        testcase( iCol==BMS-1 );
        pItem->colUsed |= ((Bitmask)1)<<(iCol>=BMS ? BMS-1 : iCol);
      }
    }
  }
  return p;
}